

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
__thiscall
Storage::Encodings::MFM::GetFMEncoder
          (MFM *this,vector<bool,_std::allocator<bool>_> *target,
          vector<bool,_std::allocator<bool>_> *fuzzy_target)

{
  unique_ptr<FMEncoder,_std::default_delete<FMEncoder>_> local_28;
  vector<bool,_std::allocator<bool>_> *local_20;
  vector<bool,_std::allocator<bool>_> *fuzzy_target_local;
  vector<bool,_std::allocator<bool>_> *target_local;
  
  local_20 = fuzzy_target;
  fuzzy_target_local = target;
  target_local = (vector<bool,_std::allocator<bool>_> *)this;
  std::
  make_unique<FMEncoder,std::vector<bool,std::allocator<bool>>&,std::vector<bool,std::allocator<bool>>*&>
            ((vector<bool,_std::allocator<bool>_> *)&local_28,
             (vector<bool,_std::allocator<bool>_> **)target);
  std::
  unique_ptr<Storage::Encodings::MFM::Encoder,std::default_delete<Storage::Encodings::MFM::Encoder>>
  ::unique_ptr<FMEncoder,std::default_delete<FMEncoder>,void>
            ((unique_ptr<Storage::Encodings::MFM::Encoder,std::default_delete<Storage::Encodings::MFM::Encoder>>
              *)this,&local_28);
  std::unique_ptr<FMEncoder,_std::default_delete<FMEncoder>_>::~unique_ptr(&local_28);
  return (__uniq_ptr_data<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>,_true,_true>
          )(__uniq_ptr_data<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Encoder> Storage::Encodings::MFM::GetFMEncoder(std::vector<bool> &target, std::vector<bool> *fuzzy_target) {
	return std::make_unique<FMEncoder>(target, fuzzy_target);
}